

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::CloseGap(ON_PolyCurve *this,int gap_index,int ends_to_modify)

{
  ON_Object *p;
  ON_Object *p_00;
  double dVar1;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint Q;
  ON_3dPoint Q_00;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ON_ArcCurve *arc;
  ON_NurbsCurve *pOVar5;
  ON_Curve **ppOVar6;
  char *sFormat;
  ON_3dPoint *Q_01;
  ON_Line *line;
  int line_number;
  ulong uVar7;
  ON_3dPoint *P_01;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dPoint P0;
  ON_3dPoint P1;
  ON_Line line0;
  ON_Line line1;
  ON_3dPoint local_128;
  ON_3dPoint local_108;
  ON_ArcCurve *local_e8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c8;
  ON_Object *local_b0;
  ulong local_a8;
  ON_ArcCurve *local_a0;
  ulong local_98;
  ON_Line local_90;
  ON_Line local_60;
  
  if ((gap_index < 1) || ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= gap_index))
  {
    sFormat = "Invalid gap_index parameter.";
    line_number = 0x4b0;
LAB_005869b6:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  local_a8 = (ulong)(gap_index - 1);
  ppOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
  p = (ON_Object *)ppOVar6[local_a8];
  p_00 = (ON_Object *)ppOVar6[(uint)gap_index];
  if (p_00 == (ON_Object *)0x0 || p == (ON_Object *)0x0) {
    sFormat = "Null curve segments.";
    line_number = 0x4b8;
    goto LAB_005869b6;
  }
  ON_Curve::PointAtEnd(&local_e0,(ON_Curve *)p);
  ON_Curve::PointAtStart(&local_c8,(ON_Curve *)p_00);
  bVar3 = ON_3dPoint::operator==(&local_e0,&local_c8);
  if (bVar3) {
    return false;
  }
  local_108.z = local_e0.z;
  local_108.x = local_e0.x;
  local_108.y = local_e0.y;
  local_128.z = local_c8.z;
  local_128.x = local_c8.x;
  local_128.y = local_c8.y;
  local_98 = (ulong)(uint)gap_index;
  arc = ON_ArcCurve::Cast(p);
  local_b0 = p_00;
  local_a0 = ON_ArcCurve::Cast(p_00);
  uVar7 = local_a8;
  if (local_a0 == (ON_ArcCurve *)0x0 || arc == (ON_ArcCurve *)0x0) {
    if (local_a0 != (ON_ArcCurve *)0x0 || arc == (ON_ArcCurve *)0x0) {
      local_e8 = arc;
      if (arc == (ON_ArcCurve *)0x0 && local_a0 != (ON_ArcCurve *)0x0) {
        local_108.z = local_c8.z;
        local_108.x = local_c8.x;
        local_108.y = local_c8.y;
      }
      else {
        ON_Line::ON_Line(&local_90);
        ON_Line::ON_Line(&local_60);
        if (local_e8 == (ON_ArcCurve *)0x0) {
          bVar3 = ON_Curve::LastSpanIsLinear((ON_Curve *)p,0.0,0.0,&local_90);
          bVar4 = ON_Curve::FirstSpanIsLinear((ON_Curve *)local_b0,0.0,0.0,&local_60);
          if (bVar3 && bVar4) {
            LineLineTieBreaker(&local_90,&local_60,&local_108,&local_128);
          }
          else if (bVar4 || bVar3) {
            Q_01 = &local_108;
            if (bVar3) {
              Q_01 = &local_128;
            }
            P_01 = &local_c8;
            if (bVar3) {
              P_01 = &local_e0;
            }
            line = &local_60;
            if (bVar3) {
              line = &local_90;
            }
            SetLineIsoCoords(line,P_01,Q_01);
          }
        }
        ON_Line::~ON_Line(&local_60);
        ON_Line::~ON_Line(&local_90);
        arc = local_e8;
      }
      goto LAB_00586c16;
    }
  }
  else {
    local_e8 = (ON_ArcCurve *)ON_Arc::Length(&local_a0->m_arc);
    dVar1 = ON_Arc::Length(&arc->m_arc);
    if (dVar1 <= (double)local_e8) {
      local_108.z = local_c8.z;
      local_108.x = local_c8.x;
      local_108.y = local_c8.y;
      uVar7 = local_a8;
      goto LAB_00586c16;
    }
  }
  local_128.z = local_e0.z;
  local_128.x = local_e0.x;
  local_128.y = local_e0.y;
  uVar7 = local_a8;
LAB_00586c16:
  if ((local_108.x != local_128.x) || (NAN(local_108.x) || NAN(local_128.x))) {
    local_128.x = (local_e0.x + local_c8.x) * 0.5;
    local_108.x = local_128.x;
  }
  if ((local_108.y != local_128.y) || (NAN(local_108.y) || NAN(local_128.y))) {
    local_128.y = (local_e0.y + local_c8.y) * 0.5;
    local_108.y = local_128.y;
  }
  if ((local_108.z != local_128.z) || (NAN(local_108.z) || NAN(local_128.z))) {
    local_128.z = (local_e0.z + local_c8.z) * 0.5;
    local_108.z = local_128.z;
  }
  bVar3 = ON_3dPoint::operator!=(&local_108,&local_e0);
  if (bVar3) {
    if (arc == (ON_ArcCurve *)0x0) {
      (*p->_vptr_ON_Object[0x3a])(p);
    }
    else {
      P.y._0_4_ = SUB84(local_e0.y,0);
      P.x = local_e0.x;
      P.y._4_4_ = (int)((ulong)local_e0.y >> 0x20);
      P.z = local_e0.z;
      Q.y = local_108.y;
      Q.x = local_108.x;
      Q.z = local_108.z;
      pOVar5 = ChangeArcEnd(arc,P,Q,1);
      if (pOVar5 != (ON_NurbsCurve *)0x0) {
        ppOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        if (ppOVar6[uVar7] != (ON_Curve *)0x0) {
          (*(ppOVar6[uVar7]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          ppOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        }
        ppOVar6[uVar7] = &pOVar5->super_ON_Curve;
      }
    }
  }
  bVar3 = ON_3dPoint::operator!=(&local_128,&local_c8);
  uVar2 = local_98;
  if (bVar3) {
    if (local_a0 == (ON_ArcCurve *)0x0) {
      (*local_b0->_vptr_ON_Object[0x39])();
    }
    else {
      P_00.y._0_4_ = SUB84(local_c8.y,0);
      P_00.x = local_c8.x;
      P_00.y._4_4_ = (int)((ulong)local_c8.y >> 0x20);
      P_00.z = local_c8.z;
      Q_00.y = local_128.y;
      Q_00.x = local_128.x;
      Q_00.z = local_128.z;
      pOVar5 = ChangeArcEnd(local_a0,P_00,Q_00,0);
      if (pOVar5 != (ON_NurbsCurve *)0x0) {
        ppOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        if (ppOVar6[uVar2] != (ON_Curve *)0x0) {
          (*(ppOVar6[uVar2]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          ppOVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
        }
        ppOVar6[uVar2] = &pOVar5->super_ON_Curve;
      }
    }
  }
  bVar3 = HasGapAt(this,(int)uVar7);
  return !bVar3;
}

Assistant:

bool ON_PolyCurve::CloseGap( int gap_index, int ends_to_modify )
{
  const int count = m_segment.Count();

  if ( gap_index <= 0 || gap_index >= count )
  {
    ON_ERROR("Invalid gap_index parameter.");
    return 0; // nothing to do
  }

  ON_Curve* c0 = m_segment[gap_index-1];
  ON_Curve* c1 = m_segment[gap_index];
  if ( 0 == c0 || 0 == c1 )
  {
    ON_ERROR("Null curve segments.");
    return false; // invalid polycurve
  }

  const ON_3dPoint P0 = c0->PointAtEnd();
  const ON_3dPoint P1 = c1->PointAtStart();
  if ( P0 == P1 )
    return false; // nothing to do

  ON_3dPoint Q0(P0);
  ON_3dPoint Q1(P1);

  const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
  const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);

  if ( 0 != arc0 && 0 != arc1 )
  {
    if ( arc1->m_arc.Length() < arc0->m_arc.Length() )
      Q1 = P0;
    else
      Q0 = P1;
  }
  else if ( 0 != arc0 && 0 == arc1 )
  {
    Q1 = P0;
  }
  else if ( 0 != arc1 && 0 == arc0 )
  {
    Q0 = P1;
  }
  else
  {
    ON_Line line0, line1;
    double min_line_length = 0.0;
    double is_linear_tolerance = 0.0;
    bool bLine0 = (0 == arc0)
                ? c0->LastSpanIsLinear(min_line_length,is_linear_tolerance,&line0)
                : false;
    bool bLine1 = (0 == arc0)
                ? c1->FirstSpanIsLinear(min_line_length,is_linear_tolerance,&line1)
                : false;
    if ( bLine0 && bLine1 )
      LineLineTieBreaker(line0,line1,Q0,Q1);
    else if ( bLine0 )
      SetLineIsoCoords(line0,P0,Q1);
    else if ( bLine1 )
      SetLineIsoCoords(line1,P1,Q0);
  }

  if ( Q0.x != Q1.x )
    Q0.x = Q1.x = 0.5*(P0.x + P1.x);
  if ( Q0.y != Q1.y )
    Q0.y = Q1.y = 0.5*(P0.y + P1.y);
  if ( Q0.z != Q1.z )
    Q0.z = Q1.z = 0.5*(P0.z + P1.z);

  if ( Q0 != P0 )
  {
    if ( 0 != arc0 )
    {
      ON_NurbsCurve* nc0 = ChangeArcEnd( arc0, P0, Q0 , 1 );
      if ( nc0 )
      {
        delete m_segment[gap_index-1];
        m_segment[gap_index-1] = nc0;
        c0 = nc0;
        arc0 = 0;
      }
    }
    else
    {
      c0->SetEndPoint(Q0);
    }
  }

  if ( Q1 != P1 )
  {
    if ( 0 != arc1 )
    {
      ON_NurbsCurve* nc1 = ChangeArcEnd( arc1, P1, Q1, 0 );
      if ( nc1 )
      {
        delete m_segment[gap_index];
        m_segment[gap_index] = nc1;
        c0 = nc1;
        arc1 = 0;
      }
    }
    else
    {
      c1->SetStartPoint(Q1);
    }
  }

  return HasGapAt(gap_index-1) ? false : true;
}